

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_staj_event<char>::as_bool(basic_staj_event<char> *this,error_code *ec)

{
  undefined8 in_RSI;
  error_code *in_RDI;
  bool local_1;
  
  switch((char)in_RDI->_M_value) {
  case '\x04':
    local_1 = (bool)((byte)in_RDI[1]._M_value & 1);
    break;
  case '\x05':
    local_1 = *(long *)(in_RDI + 1) != 0;
    break;
  case '\x06':
    local_1 = *(long *)(in_RDI + 1) != 0;
    break;
  default:
    std::error_code::operator=(in_RDI,(conv_errc)((ulong)in_RSI >> 0x20));
    local_1 = false;
    break;
  case '\t':
    local_1 = *(double *)(in_RDI + 1) != 0.0;
  }
  return local_1;
}

Assistant:

bool as_bool(std::error_code& ec) const
    {
        switch (event_type_)
        {
            case staj_event_type::bool_value:
                return value_.bool_value_;
            case staj_event_type::double_value:
                return value_.double_value_ != 0.0;
            case staj_event_type::int64_value:
                return value_.int64_value_ != 0;
            case staj_event_type::uint64_value:
                return value_.uint64_value_ != 0;
            default:
                ec = conv_errc::not_bool;
                return bool();
        }
    }